

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cc
# Opt level: O0

void __thiscall
prometheus::detail::Endpoint::Endpoint(Endpoint *this,CivetServer *server,string *uri)

{
  CivetServer *this_00;
  element_type *args;
  pointer handler;
  weak_ptr<prometheus::Collectable> local_40 [2];
  string *local_20;
  string *uri_local;
  CivetServer *server_local;
  Endpoint *this_local;
  
  this->server_ = server;
  local_20 = uri;
  uri_local = (string *)server;
  server_local = (CivetServer *)this;
  std::__cxx11::string::string((string *)&this->uri_,(string *)uri);
  std::make_shared<prometheus::Registry>();
  args = std::__shared_ptr_access<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->endpoint_registry_);
  make_unique<prometheus::detail::MetricsHandler,prometheus::Registry&>
            ((detail *)&this->metrics_handler_,args);
  std::unique_ptr<prometheus::BasicAuthHandler,std::default_delete<prometheus::BasicAuthHandler>>::
  unique_ptr<std::default_delete<prometheus::BasicAuthHandler>,void>
            ((unique_ptr<prometheus::BasicAuthHandler,std::default_delete<prometheus::BasicAuthHandler>>
              *)&this->auth_handler_);
  std::weak_ptr<prometheus::Collectable>::weak_ptr<prometheus::Registry,void>
            (local_40,&this->endpoint_registry_);
  RegisterCollectable(this,local_40);
  std::weak_ptr<prometheus::Collectable>::~weak_ptr(local_40);
  this_00 = this->server_;
  handler = std::
            unique_ptr<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
            ::get(&this->metrics_handler_);
  CivetServer::addHandler(this_00,&this->uri_,&handler->super_CivetHandler);
  return;
}

Assistant:

Endpoint::Endpoint(CivetServer& server, std::string uri)
    : server_(server),
      uri_(std::move(uri)),
      endpoint_registry_(std::make_shared<Registry>()),
      metrics_handler_(
          detail::make_unique<MetricsHandler>(*endpoint_registry_)) {
  RegisterCollectable(endpoint_registry_);
  server_.addHandler(uri_, metrics_handler_.get());
}